

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastGtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  ParseContext *pPVar5;
  byte bVar6;
  bool bVar7;
  unsigned_short uVar8;
  uint16_t uVar9;
  int iVar10;
  uint32_t uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  FieldAux *pFVar15;
  EpsCopyInputStream *this;
  EpsCopyInputStream *pEVar16;
  LogMessage *pLVar17;
  uint *puVar18;
  ulong uVar19;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_2d8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2d0;
  TcParseTableBase ***local_2c8;
  anon_class_24_3_e92acbd4 inner_loop;
  MessageLite *submsg;
  TcParseTableBase *inner_table;
  RepeatedPtrFieldBase *field;
  FieldAux aux;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_288;
  unsigned_short expected_tag;
  uint64_t local_280;
  TcParseTableBase *local_278;
  ParseContext *local_270;
  char *local_268;
  MessageLite *local_260;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_258;
  TcFieldData local_250;
  TcFieldData local_248;
  undefined1 local_239;
  uint64_t uStack_238;
  bool always_return;
  TcParseTableBase *local_230;
  ParseContext *local_228;
  char *local_220;
  MessageLite *local_218;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_210;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_208;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_200;
  TcFieldData data_2;
  FastFieldEntry *fast_entry_1;
  size_t idx_1;
  unsigned_short coded_tag_1;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  LogMessage local_110;
  Voidify local_f9;
  Nullable<const_char_*> local_f8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_d9;
  Nullable<const_char_*> local_d8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_bc;
  char *local_b8;
  ParseContext *local_b0;
  char *local_a8;
  char *local_a0;
  TcParseTableBase ****local_98;
  TcFieldData local_90;
  EpsCopyInputStream *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_280 = hasbits;
  local_278 = table;
  local_270 = ctx;
  local_268 = ptr;
  local_260 = msg;
  local_258 = data.field_0;
  uVar8 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_258);
  pMVar3 = local_260;
  pcVar14 = local_268;
  pPVar2 = local_270;
  if (uVar8 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffd78);
    pcVar14 = MiniParse(pMVar3,pcVar14,pPVar2,(TcFieldData)aStack_288,local_278,local_280);
    return pcVar14;
  }
  aux.enum_range.last._2_2_ = UnalignedLoad<unsigned_short>(local_268);
  pTVar1 = local_278;
  bVar6 = TcFieldData::aux_idx((TcFieldData *)&local_258);
  pFVar15 = TcParseTableBase::field_aux(pTVar1,(uint)bVar6);
  pMVar3 = local_260;
  field = (RepeatedPtrFieldBase *)pFVar15->table;
  uVar9 = TcFieldData::offset((TcFieldData *)&local_258);
  inner_table = (TcParseTableBase *)
                RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(pMVar3,(ulong)uVar9);
  submsg = (MessageLite *)field;
  do {
    local_268 = local_268 + 2;
    inner_loop.inner_table =
         (TcParseTableBase **)
         AddMessage((TcParseTableBase *)submsg,(RepeatedPtrFieldBase *)inner_table);
    pcVar14 = local_268;
    pPVar2 = local_270;
    local_2c8 = &inner_loop.inner_table;
    inner_loop.submsg = (MessageLite **)&local_270;
    inner_loop.ctx = (ParseContext **)&submsg;
    local_bc = FastDecodeTag(aux.enum_range.last._2_2_);
    local_b0 = pPVar2;
    local_b8 = pcVar14;
    _old_group_depth = &local_2c8;
    iVar10 = pPVar2->depth_ + -1;
    pPVar2->depth_ = iVar10;
    if (iVar10 < 0) {
      local_a8 = (char *)0x0;
    }
    else {
      pPVar2->group_depth_ = pPVar2->group_depth_ + 1;
      absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
      absl_log_internal_check_op_result._0_4_ = pPVar2->group_depth_;
      local_a0 = pcVar14;
      local_70 = (MessageLite *)*local_2c8;
      local_80 = (ParseContext *)*inner_loop.submsg;
      local_78 = pcVar14;
      local_88 = (EpsCopyInputStream *)
                 (((*inner_loop.ctx)->super_EpsCopyInputStream).patch_buffer_ + 0x10);
      local_98 = _old_group_depth;
      while (bVar7 = ParseContext::Done(local_80,&local_78), pMVar3 = local_70, pcVar14 = local_78,
            pPVar5 = local_80, ((bVar7 ^ 0xffU) & 1) != 0) {
        TcFieldData::TcFieldData(&local_90);
        pEVar16 = local_88;
        this = (EpsCopyInputStream *)((long)local_88 + -0x38);
        uVar8 = UnalignedLoad<unsigned_short>(pcVar14);
        if (((long)(int)((uint)uVar8 & (uint)*(byte *)((long)pEVar16 + -0x30)) & 7U) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry
                       ((TcParseTableBase *)this,
                        (ulong)(long)(int)((uint)uVar8 & (uint)*(byte *)((long)pEVar16 + -0x30)) >>
                        3);
        local_58.data =
             (ulong)uVar8 ^
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_60.data = local_58.data;
        local_78 = (*UNRECOVERED_JUMPTABLE)
                             (pMVar3,pcVar14,pPVar5,(TcFieldData)local_58,(TcParseTableBase *)this,0
                             );
        if ((local_78 == (char *)0x0) ||
           (uVar11 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar11 != 1))
        break;
      }
      pEVar16 = (EpsCopyInputStream *)((long)local_88 + -0x38);
      if ((*(byte *)((long)local_88 + -0x2f) & 1) == 0) {
        local_88 = pEVar16;
        if (local_78 == (char *)0x0) {
          VerifyHasBitConsistency(local_70,(TcParseTableBase *)pEVar16);
        }
        local_68 = local_78;
      }
      else {
        pcVar14 = (char *)((long)local_88 + -0x10);
        local_88 = pEVar16;
        local_68 = (char *)(**(code **)pcVar14)(local_70,local_78,local_80);
      }
      local_b8 = local_68;
      if (local_68 != (char *)0x0) {
        iVar10 = absl::lts_20250127::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result._4_4_);
        iVar12 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->depth_);
        local_d8 = absl::lts_20250127::log_internal::Check_EQImpl
                             (iVar10,iVar12,"old_depth == depth_");
        if (local_d8 != (Nullable<const_char_*>)0x0) {
          pcVar14 = absl::lts_20250127::implicit_cast<char_const*>(local_d8);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x491,pcVar14);
          pLVar17 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                              ((LogMessage *)&absl_log_internal_check_op_result_1);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_d9,pLVar17);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
        }
        iVar10 = absl::lts_20250127::log_internal::GetReferenceableValue
                           ((int)absl_log_internal_check_op_result);
        iVar12 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->group_depth_);
        local_f8 = absl::lts_20250127::log_internal::Check_EQImpl
                             (iVar10,iVar12,"old_group_depth == group_depth_");
        if (local_f8 != (Nullable<const_char_*>)0x0) {
          pcVar14 = absl::lts_20250127::implicit_cast<char_const*>(local_f8);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_110,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x492,pcVar14);
          pLVar17 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_f9,pLVar17);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_110);
        }
        local_f8 = (Nullable<const_char_*>)0x0;
      }
      pPVar2->group_depth_ = pPVar2->group_depth_ + -1;
      pPVar2->depth_ = pPVar2->depth_ + 1;
      bVar7 = EpsCopyInputStream::ConsumeEndGroup(&pPVar2->super_EpsCopyInputStream,local_bc);
      if (((bVar7 ^ 0xffU) & 1) == 0) {
        local_a8 = local_b8;
      }
      else {
        local_a8 = (char *)0x0;
      }
    }
    pMVar3 = local_260;
    pPVar2 = local_270;
    local_268 = local_a8;
    if (local_a8 == (char *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_2d0);
      pcVar14 = Error(pMVar3,(char *)0x0,pPVar2,(TcFieldData)local_2d0,local_278,local_280);
      return pcVar14;
    }
    bVar7 = EpsCopyInputStream::DataAvailable(&local_270->super_EpsCopyInputStream,local_a8);
    pMVar3 = local_260;
    pcVar14 = local_268;
    if (((bVar7 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_2d8);
      if (local_278->has_bits_offset != 0) {
        uVar13 = (uint)local_280;
        puVar18 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_278->has_bits_offset);
        *puVar18 = uVar13 | *puVar18;
      }
      return pcVar14;
    }
    uVar8 = UnalignedLoad<unsigned_short>(local_268);
    local_218 = local_260;
    local_220 = local_268;
    local_228 = local_270;
    if (uVar8 != aux.enum_range.last._2_2_) {
      TcFieldData::TcFieldData(&data_local);
      local_210 = data_local.field_0;
      local_230 = local_278;
      uStack_238 = local_280;
      local_239 = 0;
      bVar7 = EpsCopyInputStream::DataAvailable(&local_228->super_EpsCopyInputStream,local_220);
      pMVar3 = local_218;
      pcVar14 = local_220;
      pPVar2 = local_228;
      if (!bVar7) {
        TcFieldData::TcFieldData(&local_248);
        if (local_230->has_bits_offset != 0) {
          uVar13 = (uint)uStack_238;
          puVar18 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_230->has_bits_offset);
          *puVar18 = uVar13 | *puVar18;
        }
        return pcVar14;
      }
      TcFieldData::TcFieldData(&local_250);
      pTVar1 = local_230;
      uVar4 = uStack_238;
      uVar8 = UnalignedLoad<unsigned_short>(pcVar14);
      uVar19 = (ulong)(int)((uint)uVar8 & (uint)pTVar1->fast_idx_mask);
      if ((uVar19 & 7) == 0) {
        data_2.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar1,uVar19 >> 3);
        local_200.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_2.field_0 + 8))->data ^
             (ulong)uVar8;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_2.field_0);
        local_208.data = local_200.data;
        pcVar14 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar3,pcVar14,pPVar2,(TcFieldData)local_200,pTVar1,uVar4);
        return pcVar14;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}